

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# narpc_storage_client.cc
# Opt level: O0

Future<int> * __thiscall
NarpcStorageClient::WriteData
          (NarpcStorageClient *this,int key,longlong address,shared_ptr<crail::ByteBuffer> *buf)

{
  int iVar1;
  shared_ptr<RpcMessage> *response_00;
  shared_ptr<AsyncTask<int>_> *task;
  long in_RSI;
  Future<int> *in_RDI;
  shared_ptr<crail::ByteBuffer> *in_R8;
  shared_ptr<NarpcWriteResponse> response;
  shared_ptr<NarpcWriteRequest> request;
  undefined4 in_stack_ffffffffffffff18;
  int in_stack_ffffffffffffff1c;
  shared_ptr<RpcMessage> *in_stack_ffffffffffffff20;
  Future<int> *this_00;
  shared_ptr<AsyncTask<int>_> local_98;
  undefined4 local_84;
  Future<int> local_70;
  shared_ptr<RpcMessage> *in_stack_ffffffffffffffb8;
  RpcClient *in_stack_ffffffffffffffc0;
  
  std::make_shared<NarpcWriteRequest,int&,long_long&,std::shared_ptr<crail::ByteBuffer>&>
            ((int *)in_RDI,(longlong *)in_RDI,in_R8);
  response_00 = (shared_ptr<RpcMessage> *)(in_RSI + 8);
  std::make_shared<NarpcWriteResponse,RpcClient*>((RpcClient **)in_R8);
  task = (shared_ptr<AsyncTask<int>_> *)(in_RSI + 8);
  this_00 = &local_70;
  std::shared_ptr<RpcMessage>::shared_ptr<NarpcWriteRequest,void>
            (in_stack_ffffffffffffff20,
             (shared_ptr<NarpcWriteRequest> *)
             CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  std::shared_ptr<RpcMessage>::shared_ptr<NarpcWriteResponse,void>
            (in_stack_ffffffffffffff20,
             (shared_ptr<NarpcWriteResponse> *)
             CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  iVar1 = RpcClient::IssueRequest(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,response_00);
  std::shared_ptr<RpcMessage>::~shared_ptr((shared_ptr<RpcMessage> *)0x172bea);
  std::shared_ptr<RpcMessage>::~shared_ptr((shared_ptr<RpcMessage> *)0x172bf4);
  if (iVar1 < 0) {
    Future<int>::Failure(in_stack_ffffffffffffff1c);
  }
  else {
    std::shared_ptr<AsyncTask<int>>::shared_ptr<NarpcWriteResponse,void>
              (&local_98,
               (shared_ptr<NarpcWriteResponse> *)
               CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    Future<int>::Future(this_00,task);
    std::shared_ptr<AsyncTask<int>_>::~shared_ptr((shared_ptr<AsyncTask<int>_> *)0x172cac);
  }
  local_84 = 1;
  std::shared_ptr<NarpcWriteResponse>::~shared_ptr((shared_ptr<NarpcWriteResponse> *)0x172ce3);
  std::shared_ptr<NarpcWriteRequest>::~shared_ptr((shared_ptr<NarpcWriteRequest> *)0x172cf0);
  return in_RDI;
}

Assistant:

Future<int> NarpcStorageClient::WriteData(int key, long long address,
                                          shared_ptr<ByteBuffer> buf) {
  shared_ptr<NarpcWriteRequest> request =
      make_shared<NarpcWriteRequest>(key, address, buf);
  shared_ptr<NarpcWriteResponse> response =
      make_shared<NarpcWriteResponse>(&rpc_client_);

  if (rpc_client_.IssueRequest(request, response) < 0) {
    return Future<int>::Failure(-1);
  }
  return Future<int>(response);
}